

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O3

void nn_surveyor_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  uint extraout_EDX_04;
  int extraout_EDX_05;
  nn_surveyor *self_00;
  nn_sockbase *self_01;
  ulong uVar2;
  
  self_00 = (nn_surveyor *)&self[-5].shutdown_fn;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_surveyor *)0x0;
  }
  switch(self_00->state) {
  case 1:
    break;
  case 2:
switchD_001274a6_caseD_2:
    if (src != -2) goto LAB_001275b4;
    if (type == 1) {
LAB_00127585:
      nn_surveyor_resend(self_00);
      nn_timer_start(&self_00->timer,self_00->deadline);
      self_00->state = 3;
      return;
    }
    nn_surveyor_handler_cold_11();
    type = extraout_EDX_02;
    goto LAB_00127540;
  case 3:
    goto switchD_001274a6_caseD_3;
  case 4:
    if (src != 1) {
      if (src == -2) {
        if (type == 2) {
          return;
        }
        nn_surveyor_handler_cold_5();
        type = extraout_EDX_01;
        goto switchD_001274a6_caseD_2;
      }
      goto LAB_001275d4;
    }
    if (type == 2) goto LAB_00127585;
    goto LAB_001275f2;
  case 5:
    goto switchD_001274a6_caseD_5;
  default:
switchD_001274a6_default:
    nn_surveyor_handler_cold_14();
    goto LAB_001275c2;
  }
  if (src != -2) {
    nn_surveyor_handler_cold_12();
LAB_001275b4:
    nn_surveyor_handler_cold_10();
    goto switchD_001274a6_default;
  }
  if (type == -2) goto LAB_00127549;
  nn_surveyor_handler_cold_13();
  type = extraout_EDX;
switchD_001274a6_caseD_5:
  if (src == 1) {
LAB_00127540:
    if (type == 2) {
LAB_00127549:
      self_00->state = 2;
      return;
    }
LAB_001275dd:
    nn_surveyor_handler_cold_1();
LAB_001275e4:
    nn_surveyor_handler_cold_8();
  }
  else {
    if (src != -2) {
LAB_001275c2:
      nn_surveyor_handler_cold_3();
LAB_001275cb:
      nn_surveyor_handler_cold_9();
      type = extraout_EDX_03;
LAB_001275d4:
      src = type;
      nn_surveyor_handler_cold_6();
      goto LAB_001275dd;
    }
    if (type == 2) {
LAB_001274fe:
      self_00->state = 4;
      return;
    }
    nn_surveyor_handler_cold_2();
    type = extraout_EDX_00;
switchD_001274a6_caseD_3:
    if (src != 1) {
      if (src != -2) goto LAB_001275cb;
      if (type == 2) {
        nn_timer_stop(&self_00->timer);
        goto LAB_001274fe;
      }
      goto LAB_001275e4;
    }
    if (type == 1) {
      nn_timer_stop(&self_00->timer);
      self_00->state = 5;
      self_00->timedout = 1;
      return;
    }
  }
  nn_surveyor_handler_cold_7();
  type = extraout_EDX_04;
LAB_001275f2:
  uVar2 = (ulong)(uint)type;
  nn_surveyor_handler_cold_4();
  self_01 = (nn_sockbase *)(uVar2 - 0x1b0);
  if (uVar2 == 0) {
    self_01 = (nn_sockbase *)0x0;
  }
  if (extraout_EDX_05 != -3 || src != -2) {
    if (*(int *)&self_01[0x20].sock == 6) goto LAB_0012763c;
    nn_surveyor_shutdown_cold_1();
  }
  nn_timer_stop((nn_timer *)(self_01 + 0x21));
  *(undefined4 *)&self_01[0x20].sock = 6;
LAB_0012763c:
  iVar1 = nn_timer_isidle((nn_timer *)(self_01 + 0x21));
  if (iVar1 != 0) {
    *(undefined4 *)&self_01[0x20].sock = 1;
    nn_fsm_stopped_noevent((nn_fsm *)(self_01 + 0x1b));
    nn_sockbase_stopped(self_01);
    return;
  }
  return;
}

Assistant:

static void nn_surveyor_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, fsm);

    switch (surveyor->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The socket was created recently.                                          */
/******************************************************************************/
    case NN_SURVEYOR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                surveyor->state = NN_SURVEYOR_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  PASSIVE state.                                                            */
/*  There's no survey going on.                                               */
/******************************************************************************/
    case NN_SURVEYOR_STATE_PASSIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_START:
                nn_surveyor_resend (surveyor);
                nn_timer_start (&surveyor->timer, surveyor->deadline);
                surveyor->state = NN_SURVEYOR_STATE_ACTIVE;
                return;

            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Survey was sent, waiting for responses.                                   */
/******************************************************************************/
    case NN_SURVEYOR_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                nn_timer_stop (&surveyor->timer);
                surveyor->state = NN_SURVEYOR_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&surveyor->timer);
                surveyor->state = NN_SURVEYOR_STATE_STOPPING_TIMER;
                surveyor->timedout = NN_SURVEYOR_TIMEDOUT;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  CANCELLING state.                                                         */
/*  Survey was cancelled, but the old timer haven't stopped yet. The new      */
/*  survey thus haven't been sent and is stored in 'tosend'.                  */
/******************************************************************************/
    case NN_SURVEYOR_STATE_CANCELLING:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_surveyor_resend (surveyor);
                nn_timer_start (&surveyor->timer, surveyor->deadline);
                surveyor->state = NN_SURVEYOR_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER state.                                                     */
/*  Survey timeout expired. Now we are stopping the timer.                    */
/******************************************************************************/
    case NN_SURVEYOR_STATE_STOPPING_TIMER:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                surveyor->state = NN_SURVEYOR_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                surveyor->state = NN_SURVEYOR_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (surveyor->state, src, type);
    }
}